

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_spv_func_and_recompile(CompilerMSL *this,SPVFuncImpl spv_func)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  SPVFuncImpl local_9;
  
  p_Var2 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      bVar4 = (SPVFuncImpl)p_Var2[1]._M_color < spv_func;
      if (!bVar4) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar4];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((SPVFuncImpl)p_Var3[1]._M_color <= spv_func)) {
      return;
    }
  }
  local_9 = spv_func;
  ::std::
  _Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
  ::_M_insert_unique<spirv_cross::CompilerMSL::SPVFuncImpl_const&>
            ((_Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
              *)&this->spv_function_implementations,&local_9);
  this->suppress_missing_prototypes = true;
  Compiler::force_recompile((Compiler *)this);
  return;
}

Assistant:

void CompilerMSL::add_spv_func_and_recompile(SPVFuncImpl spv_func)
{
	if (spv_function_implementations.count(spv_func) == 0)
	{
		spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
		force_recompile();
	}
}